

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O3

int main(int argc,char **argv)

{
  ssh_key *psVar1;
  size_t sVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  cmdline_instance *pcVar7;
  Filename *pFVar8;
  ssh2_userkey *ptr;
  ssh_key **ppsVar9;
  AuthPolicy_ssh2_pubkey *pAVar10;
  RSAKey *pRVar11;
  FILE *__stream;
  strbuf *psVar12;
  AuthPolicy_ssh1_pubkey *rsa;
  size_t sVar13;
  uint *puVar14;
  Socket *pSVar15;
  char *pcVar16;
  SockAddr *listenaddr;
  Conf *pCVar17;
  ulong uVar18;
  size_t sVar19;
  cmdline_instance *pcVar20;
  undefined4 *puVar21;
  cmdline_instance *unaff_R12;
  unsigned_long uVar22;
  cmdline_instance *pcVar23;
  cmdline_instance *pcVar24;
  ptrlen pl;
  char *val;
  char *error_2;
  char *error;
  size_t instancessize;
  undefined1 local_a4 [4];
  cmdline_instance *local_a0;
  cmdline_instance *local_98;
  char **local_90;
  cmdline_instance *local_88;
  cmdline_instance *local_80;
  cmdline_instance *local_78;
  char *local_70;
  BinarySource local_68;
  size_t local_38;
  
  local_38 = 8;
  local_90 = argv;
  pcVar7 = (cmdline_instance *)safemalloc(8,0x110,0);
  init_cmdline_instance(pcVar7);
  if (1 < argc) {
    local_78 = (cmdline_instance *)0x1;
    local_a4 = (undefined1  [4])(argc + -1);
    local_98 = pcVar7;
    local_80 = pcVar7;
LAB_0010fa29:
    pcVar20 = (cmdline_instance *)local_a4;
    unaff_R12 = (cmdline_instance *)local_90[1];
    pl.len = (size_t)unaff_R12;
    pl.ptr = pcVar20;
    local_90 = local_90 + 1;
    iVar5 = strcmp((char *)unaff_R12,"--help");
    if (iVar5 == 0) {
      show_help(_stdout);
LAB_001107ed:
      exit(0);
    }
    _Var4 = longoptnoarg((char *)unaff_R12,"--version");
    if (_Var4) {
      pcVar16 = buildinfo("\n");
      printf("%s: %s\n%s\n","Uppity","Unidentified build",pcVar16);
      safefree(pcVar16);
      goto LAB_001107ed;
    }
    _Var4 = longoptnoarg((char *)unaff_R12,"--verbose");
    if ((_Var4) ||
       ((((char)unaff_R12->listen_port == '-' &&
         (*(char *)((long)&unaff_R12->listen_port + 1) == 'v')) &&
        (*(char *)((long)&unaff_R12->listen_port + 2) == '\0')))) {
      verbose = 1;
    }
    else {
      _Var4 = longoptnoarg((char *)unaff_R12,"--and");
      pcVar7 = local_78;
      if (_Var4) {
        local_80 = (cmdline_instance *)
                   safegrowarray(local_80,&local_38,0x110,(size_t)local_78,1,false);
        unaff_R12 = (cmdline_instance *)((long)&pcVar7->listen_port + 1);
        local_98 = local_80 + (long)pcVar7;
        local_78 = unaff_R12;
        init_cmdline_instance(local_98);
      }
      else {
        _Var4 = longoptarg((char *)unaff_R12,"--listen",(char **)&local_a0,(int *)pcVar20,&local_90)
        ;
        if (_Var4) {
          if ((char)local_a0->listen_port == '/') {
            local_98->listen_port = -1;
            local_98->listen_socket = (char *)local_a0;
          }
          else {
            iVar5 = atoi((char *)local_a0);
            local_98->listen_port = iVar5;
            local_98->listen_socket = (char *)0x0;
          }
        }
        else {
          iVar5 = strcmp((char *)unaff_R12,"--listen-once");
          if (iVar5 == 0) {
            listen_once = '\x01';
          }
          else {
            _Var4 = longoptarg((char *)unaff_R12,"--hostkey",(char **)&local_a0,(int *)pcVar20,
                               &local_90);
            pcVar7 = local_a0;
            if (_Var4) {
              pFVar8 = filename_from_str((char *)local_a0);
              iVar5 = key_type(pFVar8);
              pcVar23 = local_98;
              if (iVar5 == 2) {
                if (local_98->hostkey1 != (RSAKey *)0x0) goto LAB_0011084e;
                pRVar11 = (RSAKey *)safemalloc(1,0x48,0);
                pcVar23->hostkey1 = pRVar11;
                iVar5 = rsa1_load_f(pFVar8,pRVar11,(char *)0x0,(char **)&local_68);
                unaff_R12 = pcVar23;
                if (iVar5 == 0) goto LAB_00110856;
              }
              else {
                local_88 = pcVar7;
                if (iVar5 != 3) goto LAB_00110835;
                ptr = ppk_load_f(pFVar8,(char *)0x0,(char **)&local_68);
                filename_free(pFVar8);
                if ((ptr == (ssh2_userkey *)0x0) || (psVar1 = ptr->key, psVar1 == (ssh_key *)0x0))
                goto LAB_0011080b;
                pcVar16 = (*psVar1->vt->invalid)(psVar1,0);
                if (pcVar16 != (char *)0x0) goto LAB_00110841;
                psVar1 = ptr->key;
                safefree(ptr->comment);
                safefree(ptr);
                pcVar7 = local_98;
                sVar2 = local_98->nhostkeys;
                if (sVar2 != 0) {
                  sVar19 = 0;
                  do {
                    if (local_98->hostkeys[sVar19]->vt == psVar1->vt) goto LAB_001107f9;
                    sVar19 = sVar19 + 1;
                  } while (sVar2 != sVar19);
                }
                ppsVar9 = (ssh_key **)
                          safegrowarray(local_98->hostkeys,&local_98->hostkeysize,8,sVar2,1,false);
                pcVar7->hostkeys = ppsVar9;
                sVar2 = pcVar7->nhostkeys;
                pcVar7->nhostkeys = sVar2 + 1;
                ppsVar9[sVar2] = psVar1;
              }
            }
            else {
              _Var4 = longoptarg((char *)unaff_R12,"--rsakexkey",(char **)&local_a0,(int *)local_a4,
                                 &local_90);
              if (_Var4) {
                local_88 = local_a0;
                pFVar8 = filename_from_str((char *)local_a0);
                iVar5 = key_type(pFVar8);
                pcVar7 = local_98;
                if (iVar5 != 2) goto LAB_0011081a;
                pRVar11 = (local_98->ssc).rsa_kex_key;
                if (pRVar11 == (RSAKey *)0x0) {
                  pRVar11 = (RSAKey *)safemalloc(1,0x48,0);
                  (pcVar7->ssc).rsa_kex_key = pRVar11;
                }
                else {
                  freersakey(pRVar11);
                  pRVar11 = (pcVar7->ssc).rsa_kex_key;
                }
                iVar5 = rsa1_load_f(pFVar8,pRVar11,(char *)0x0,(char **)&local_68);
                if (iVar5 == 0) goto LAB_00110826;
                (((local_98->ssc).rsa_kex_key)->sshk).vt = &ssh_rsa;
                unaff_R12 = pcVar7;
              }
              else {
                _Var4 = longoptarg((char *)unaff_R12,"--userkey",(char **)&local_a0,(int *)local_a4,
                                   &local_90);
                pcVar7 = local_a0;
                if (_Var4) {
                  pFVar8 = filename_from_str((char *)local_a0);
                  iVar5 = key_type(pFVar8);
                  if (iVar5 - 9U < 2) {
                    pcVar23 = (cmdline_instance *)strbuf_new();
                    _Var4 = ppk_loadpub_f(pFVar8,(char **)0x0,(BinarySink *)&pcVar23->nhostkeys,
                                          (char **)0x0,&local_70);
                    if (!_Var4) goto LAB_0011088e;
                    pAVar10 = (AuthPolicy_ssh2_pubkey *)safemalloc(1,0x18,(size_t)pcVar23->hostkeys)
                    ;
                    memcpy(pAVar10 + 1,pcVar23->listen_socket,(size_t)pcVar23->hostkeys);
                    ppsVar9 = pcVar23->hostkeys;
                    (pAVar10->public_blob).ptr = pAVar10 + 1;
                    (pAVar10->public_blob).len = (size_t)ppsVar9;
                    pAVar10->next = (local_98->aps).ssh2keys;
                    (local_98->aps).ssh2keys = pAVar10;
                    strbuf_free((strbuf *)pcVar23);
                    unaff_R12 = pcVar23;
                  }
                  else {
                    local_88 = pcVar7;
                    pcVar23 = unaff_R12;
                    if (iVar5 != 8) goto LAB_00110873;
                    pcVar23 = (cmdline_instance *)strbuf_new();
                    iVar5 = rsa1_loadpub_f(pFVar8,(BinarySink *)&pcVar23->nhostkeys,(char **)0x0,
                                           &local_70);
                    pcVar7 = local_98;
                    if (iVar5 == 0) goto LAB_0011087f;
                    rsa = (AuthPolicy_ssh1_pubkey *)safemalloc(1,0x50,0);
                    local_68.data = pcVar23->listen_socket;
                    local_68.len = (size_t)pcVar23->hostkeys;
                    local_68.pos = 0;
                    local_68.err = BSE_NO_ERROR;
                    local_68.binarysource_ = &local_68;
                    BinarySource_get_rsa_ssh1_pub
                              (local_68.binarysource_,(RSAKey *)rsa,RSA_SSH1_EXPONENT_FIRST);
                    rsa->next = (pcVar7->aps).ssh1keys;
                    (pcVar7->aps).ssh1keys = rsa;
                    strbuf_free((strbuf *)pcVar23);
                    unaff_R12 = pcVar23;
                  }
                }
                else {
                  _Var4 = longoptarg((char *)unaff_R12,"--bannerfile",(char **)&local_a0,
                                     (int *)local_a4,&local_90);
                  pcVar23 = local_a0;
                  if (_Var4) {
                    __stream = fopen((char *)local_a0,"r");
                    if (__stream == (FILE *)0x0) goto LAB_0011086b;
                    psVar12 = strbuf_new();
                    _Var4 = read_file_into(psVar12->binarysink_,(FILE *)__stream);
                    if (!_Var4) goto LAB_00110863;
                    fclose(__stream);
                    sVar2 = psVar12->len;
                    (local_98->ssc).banner.ptr = psVar12->u;
                    (local_98->ssc).banner.len = sVar2;
                    unaff_R12 = pcVar23;
                  }
                  else {
                    _Var4 = longoptarg((char *)unaff_R12,"--bannertext",(char **)&local_a0,
                                       (int *)local_a4,&local_90);
                    pcVar7 = local_a0;
                    if (_Var4) {
                      sVar13 = strlen((char *)local_a0);
                      (local_98->ssc).banner.ptr = pcVar7;
                      (local_98->ssc).banner.len = sVar13;
                      unaff_R12 = pcVar7;
                    }
                    else {
                      _Var4 = longoptarg((char *)unaff_R12,"--sessiondir",(char **)&local_a0,
                                         (int *)local_a4,&local_90);
                      if (_Var4) {
                        (local_98->ssc).session_starting_dir = (char *)local_a0;
                      }
                      else {
                        _Var4 = longoptarg((char *)unaff_R12,"--kexinit-kex",(char **)&local_a0,
                                           (int *)local_a4,&local_90);
                        pcVar7 = local_a0;
                        if (_Var4) {
                          sVar13 = strlen((char *)local_a0);
                          (local_98->ssc).kex_override[0].ptr = pcVar7;
                          (local_98->ssc).kex_override[0].len = sVar13;
                          unaff_R12 = pcVar7;
                        }
                        else {
                          _Var4 = longoptarg((char *)unaff_R12,"--kexinit-hostkey",
                                             (char **)&local_a0,(int *)local_a4,&local_90);
                          pcVar7 = local_a0;
                          if (_Var4) {
                            sVar13 = strlen((char *)local_a0);
                            (local_98->ssc).kex_override[1].ptr = pcVar7;
                            (local_98->ssc).kex_override[1].len = sVar13;
                            unaff_R12 = pcVar7;
                          }
                          else {
                            _Var4 = longoptarg((char *)unaff_R12,"--kexinit-cscipher",
                                               (char **)&local_a0,(int *)local_a4,&local_90);
                            pcVar7 = local_a0;
                            if (_Var4) {
                              sVar13 = strlen((char *)local_a0);
                              (local_98->ssc).kex_override[2].ptr = pcVar7;
                              (local_98->ssc).kex_override[2].len = sVar13;
                              unaff_R12 = pcVar7;
                            }
                            else {
                              _Var4 = longoptarg((char *)unaff_R12,"--kexinit-csmac",
                                                 (char **)&local_a0,(int *)local_a4,&local_90);
                              pcVar7 = local_a0;
                              if (_Var4) {
                                sVar13 = strlen((char *)local_a0);
                                (local_98->ssc).kex_override[4].ptr = pcVar7;
                                (local_98->ssc).kex_override[4].len = sVar13;
                                unaff_R12 = pcVar7;
                              }
                              else {
                                _Var4 = longoptarg((char *)unaff_R12,"--kexinit-cscomp",
                                                   (char **)&local_a0,(int *)local_a4,&local_90);
                                pcVar7 = local_a0;
                                if (_Var4) {
                                  sVar13 = strlen((char *)local_a0);
                                  (local_98->ssc).kex_override[6].ptr = pcVar7;
                                  (local_98->ssc).kex_override[6].len = sVar13;
                                  unaff_R12 = pcVar7;
                                }
                                else {
                                  _Var4 = longoptarg((char *)unaff_R12,"--kexinit-sccipher",
                                                     (char **)&local_a0,(int *)local_a4,&local_90);
                                  pcVar7 = local_a0;
                                  if (_Var4) {
                                    sVar13 = strlen((char *)local_a0);
                                    (local_98->ssc).kex_override[3].ptr = pcVar7;
                                    (local_98->ssc).kex_override[3].len = sVar13;
                                    unaff_R12 = pcVar7;
                                  }
                                  else {
                                    _Var4 = longoptarg((char *)unaff_R12,"--kexinit-scmac",
                                                       (char **)&local_a0,(int *)local_a4,&local_90)
                                    ;
                                    pcVar7 = local_a0;
                                    if (_Var4) {
                                      sVar13 = strlen((char *)local_a0);
                                      (local_98->ssc).kex_override[5].ptr = pcVar7;
                                      (local_98->ssc).kex_override[5].len = sVar13;
                                      unaff_R12 = pcVar7;
                                    }
                                    else {
                                      _Var4 = longoptarg((char *)unaff_R12,"--kexinit-sccomp",
                                                         (char **)&local_a0,(int *)local_a4,
                                                         &local_90);
                                      pcVar7 = local_a0;
                                      if (_Var4) {
                                        sVar13 = strlen((char *)local_a0);
                                        (local_98->ssc).kex_override[7].ptr = pcVar7;
                                        (local_98->ssc).kex_override[7].len = sVar13;
                                        unaff_R12 = pcVar7;
                                      }
                                      else {
                                        _Var4 = longoptarg((char *)unaff_R12,"--allow-auth",
                                                           (char **)&local_a0,(int *)pcVar20,
                                                           &local_90);
                                        pcVar23 = local_a0;
                                        if (_Var4) {
                                          uVar6 = auth_method_from_name((char *)local_a0);
                                          if (uVar6 == 0) goto LAB_0011089b;
                                          local_98->auth_methods = local_98->auth_methods | uVar6;
                                          unaff_R12 = pcVar23;
                                        }
                                        else {
                                          _Var4 = longoptarg((char *)unaff_R12,"--deny-auth",
                                                             (char **)&local_a0,(int *)local_a4,
                                                             &local_90);
                                          pcVar23 = local_a0;
                                          if (_Var4) {
                                            uVar6 = auth_method_from_name((char *)local_a0);
                                            if (uVar6 == 0) goto LAB_001108a3;
                                            local_98->auth_methods = local_98->auth_methods & ~uVar6
                                            ;
                                            unaff_R12 = pcVar23;
                                          }
                                          else {
                                            _Var4 = longoptarg((char *)unaff_R12,"--ssh1-ciphers",
                                                               (char **)&local_a0,(int *)local_a4,
                                                               &local_90);
                                            pcVar7 = local_a0;
                                            if (_Var4) {
                                              local_68.pos = strlen((char *)local_a0);
                                              local_68.data = pcVar7;
                                              pl = ptrlen_get_word((ptrlen *)&local_68,",");
                                              if (pl.len == 0) {
                                                uVar22 = 0;
                                              }
                                              else {
                                                uVar22 = 0;
                                                do {
                                                  _Var4 = ptrlen_eq_string(pl,"3des");
                                                  uVar18 = 8;
                                                  if (!_Var4) {
                                                    _Var4 = ptrlen_eq_string(pl,"blowfish");
                                                    uVar18 = 0x40;
                                                    if (!_Var4) {
                                                      _Var4 = ptrlen_eq_string(pl,"des");
                                                      uVar18 = 4;
                                                      if (!_Var4) goto LAB_001108ab;
                                                    }
                                                  }
                                                  uVar22 = uVar22 | uVar18;
                                                  pl = ptrlen_get_word((ptrlen *)&local_68,",");
                                                } while (pl.len != 0);
                                                pcVar7 = (cmdline_instance *)0x0;
                                              }
                                              (local_98->ssc).ssh1_cipher_mask = uVar22;
                                              unaff_R12 = pcVar7;
                                            }
                                            else {
                                              _Var4 = longoptnoarg((char *)unaff_R12,
                                                                   "--ssh1-no-compression");
                                              if (_Var4) {
                                                (local_98->ssc).ssh1_allow_compression = false;
                                              }
                                              else {
                                                _Var4 = longoptnoarg((char *)unaff_R12,
                                                                     "--exitsignum");
                                                if (_Var4) {
                                                  (local_98->ssc).exit_signal_numeric = true;
                                                }
                                                else {
                                                  _Var4 = longoptarg((char *)unaff_R12,"--sshlog",
                                                                     (char **)&local_a0,
                                                                     (int *)local_a4,&local_90);
                                                  if ((_Var4) ||
                                                     (_Var4 = longoptarg((char *)unaff_R12,"-sshlog"
                                                                         ,(char **)&local_a0,
                                                                         (int *)local_a4,&local_90),
                                                     _Var4)) {
                                                    unaff_R12 = (cmdline_instance *)
                                                                filename_from_str((char *)local_a0);
                                                    pcVar7 = local_98;
                                                    conf_set_filename(local_98->conf,0x81,
                                                                      (Filename *)unaff_R12);
                                                    filename_free((Filename *)unaff_R12);
                                                    pCVar17 = pcVar7->conf;
                                                    iVar5 = 3;
                                                  }
                                                  else {
                                                    _Var4 = longoptarg((char *)unaff_R12,
                                                                       "--sshrawlog",
                                                                       (char **)&local_a0,
                                                                       (int *)local_a4,&local_90);
                                                    if ((!_Var4) &&
                                                       (_Var4 = longoptarg((char *)unaff_R12,
                                                                           "-sshrawlog",
                                                                           (char **)&local_a0,
                                                                           (int *)local_a4,&local_90
                                                                          ), !_Var4)) {
                                                      iVar5 = strcmp((char *)unaff_R12,
                                                                                                                                          
                                                  "--pretend-to-accept-any-pubkey");
                                                  if (iVar5 == 0) {
                                                    (local_98->ssc).
                                                    stunt_pretend_to_accept_any_pubkey = true;
                                                  }
                                                  else {
                                                    iVar5 = strcmp((char *)unaff_R12,
                                                                                                                                      
                                                  "--open-unconditional-agent-socket");
                                                  if (iVar5 == 0) {
                                                    (local_98->ssc).
                                                    stunt_open_unconditional_agent_socket = true;
                                                  }
                                                  else {
                                                    iVar5 = strcmp((char *)unaff_R12,
                                                                   "--allow-none-auth");
                                                    if (iVar5 == 0) {
                                                      *(byte *)&local_98->auth_methods =
                                                           (byte)local_98->auth_methods | 1;
                                                    }
                                                    else {
                                                      iVar5 = strcmp((char *)unaff_R12,
                                                                     "--allow-trivial-ki-auth");
                                                      if (iVar5 == 0) {
                                                        (local_98->ssc).stunt_allow_trivial_ki_auth
                                                             = true;
                                                        goto LAB_0010ff54;
                                                      }
                                                      iVar5 = strcmp((char *)unaff_R12,
                                                                                                                                          
                                                  "--return-success-to-pubkey-offer");
                                                  if (iVar5 != 0) goto LAB_001108b6;
                                                  (local_98->ssc).
                                                  stunt_return_success_to_pubkey_offer = true;
                                                  }
                                                  }
                                                  }
                                                  goto LAB_0010ff54;
                                                  }
                                                  unaff_R12 = (cmdline_instance *)
                                                              filename_from_str((char *)local_a0);
                                                  pcVar7 = local_98;
                                                  conf_set_filename(local_98->conf,0x81,
                                                                    (Filename *)unaff_R12);
                                                  filename_free((Filename *)unaff_R12);
                                                  pCVar17 = pcVar7->conf;
                                                  iVar5 = 4;
                                                  }
                                                  conf_set_int(pCVar17,0x82,iVar5);
                                                  conf_set_int(pcVar7->conf,0x83,1);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0010ff54:
    pcVar23 = local_78;
    iVar5 = (int)local_a4 + -1;
    bVar3 = (int)local_a4 < 2;
    local_a4 = (undefined1  [4])iVar5;
    if (bVar3) goto LAB_001105a2;
    goto LAB_0010fa29;
  }
  show_help((FILE *)_stderr);
  fputc(10,_stderr);
  bVar3 = false;
  pcVar23 = (cmdline_instance *)0x1;
  local_a4 = (undefined1  [4])(argc + -1);
  pcVar24 = (cmdline_instance *)0x1;
  pcVar20 = pcVar7;
  goto LAB_001105de;
LAB_001105a2:
  if ((cmdline_instance *)0x1 < local_78) {
    bVar3 = true;
    pcVar7 = local_80;
    pcVar24 = local_78;
    pcVar20 = local_80;
    if (listen_once != '\x01') goto LAB_001105de;
    main_cold_18();
  }
  bVar3 = false;
  pcVar20 = local_80;
  if (pcVar23 == (cmdline_instance *)0x0) {
    bVar3 = true;
    pcVar24 = (cmdline_instance *)0x0;
    goto LAB_00110612;
  }
  pcVar23 = (cmdline_instance *)0x1;
  pcVar7 = local_80;
  pcVar24 = pcVar23;
LAB_001105de:
  do {
    if ((pcVar7->nhostkeys == 0) && (pcVar7->hostkey1 == (RSAKey *)0x0)) {
      main_cold_21();
LAB_001107f9:
      main_cold_15();
LAB_00110806:
      main_cold_19();
LAB_0011080b:
      main_cold_16();
LAB_0011081a:
      pcVar7 = unaff_R12;
      main_cold_10();
LAB_00110826:
      main_cold_11();
      unaff_R12 = pcVar7;
LAB_00110835:
      main_cold_17();
LAB_00110841:
      main_cold_14();
      pcVar23 = unaff_R12;
LAB_0011084e:
      main_cold_12();
LAB_00110856:
      main_cold_13();
LAB_00110863:
      main_cold_5();
LAB_0011086b:
      main_cold_6();
LAB_00110873:
      main_cold_7();
LAB_0011087f:
      main_cold_8();
LAB_0011088e:
      main_cold_9();
LAB_0011089b:
      main_cold_4();
LAB_001108a3:
      pl.len = (size_t)pcVar23;
      pl.ptr = pcVar20;
      main_cold_3();
LAB_001108ab:
      main_cold_2();
LAB_001108b6:
      puVar21 = (undefined4 *)pl.len;
      main_cold_1();
      *puVar21 = 0xffffffff;
      *(undefined8 *)(puVar21 + 2) = 0;
      *(undefined8 *)(puVar21 + 4) = 0;
      *(undefined8 *)(puVar21 + 6) = 0;
      *(undefined8 *)(puVar21 + 8) = 0;
      *(undefined8 *)(puVar21 + 10) = 0;
      pCVar17 = make_ssh_server_conf();
      *(Conf **)(puVar21 + 0x42) = pCVar17;
      memset(puVar21 + 0xe,0,0xd0);
      *(char **)(puVar21 + 0x12) = "Uppity";
      pcVar16 = getenv("HOME");
      *(char **)(puVar21 + 0x14) = pcVar16;
      *(undefined8 *)(puVar21 + 0x3e) = 0x4c;
      *(undefined1 *)(puVar21 + 0x40) = 1;
      puVar21[0xc] = 0x3e;
      return (int)pcVar16;
    }
    if (((bVar3) && (pcVar7->listen_port < 0)) && (pcVar7->listen_socket == (char *)0x0))
    goto LAB_00110806;
    pcVar23 = (cmdline_instance *)((long)&pcVar23[-1].conf + 7);
    pcVar7 = pcVar7 + 1;
  } while (pcVar23 != (cmdline_instance *)0x0);
  bVar3 = false;
LAB_00110612:
  random_ref();
  putty_signal(0xd,(_func_void_int *)0x1);
  sk_init();
  uxsel_init();
  if (!bVar3) {
    do {
      puVar14 = (uint *)safemalloc(1,0x50,0);
      uVar6 = cmdline_instance_start_next_server_config_id + 1;
      *puVar14 = cmdline_instance_start_next_server_config_id;
      cmdline_instance_start_next_server_config_id = uVar6;
      *(Conf **)(puVar14 + 2) = pcVar20->conf;
      *(SshServerConfig **)(puVar14 + 4) = &pcVar20->ssc;
      *(ssh_key ***)(puVar14 + 6) = pcVar20->hostkeys;
      puVar14[8] = (uint)pcVar20->nhostkeys;
      *(RSAKey **)(puVar14 + 10) = pcVar20->hostkey1;
      *(AuthPolicyShared **)(puVar14 + 0xe) = &pcVar20->aps;
      puVar14[0xc] = pcVar20->auth_methods;
      iVar5 = pcVar20->listen_port;
      if (iVar5 < 0) {
        pcVar16 = pcVar20->listen_socket;
        if (pcVar16 != (char *)0x0) {
          listening = 1;
          *(PlugVtable **)(puVar14 + 0x12) = &server_plugvt;
          listenaddr = unix_sock_addr(pcVar16);
          pSVar15 = new_unix_listener(listenaddr,(Plug *)(puVar14 + 0x12));
          *(Socket **)(puVar14 + 0x10) = pSVar15;
          pcVar16 = dupprintf("serv#%u: listening on Unix socket %s",(ulong)*puVar14,
                              pcVar20->listen_socket);
          goto LAB_00110743;
        }
        main_cold_20();
      }
      else {
        listening = 1;
        *(PlugVtable **)(puVar14 + 0x12) = &server_plugvt;
        pSVar15 = sk_newlistener((char *)0x0,iVar5,(Plug *)(puVar14 + 0x12),true,0);
        *(Socket **)(puVar14 + 0x10) = pSVar15;
        pcVar16 = dupprintf("serv#%u: listening on port %d",(ulong)*puVar14,
                            (ulong)(uint)pcVar20->listen_port);
LAB_00110743:
        log_to_stderr(0xffffffff,pcVar16);
        safefree(pcVar16);
      }
      pcVar20 = pcVar20 + 1;
      pcVar24 = (cmdline_instance *)((long)&pcVar24[-1].conf + 7);
    } while (pcVar24 != (cmdline_instance *)0x0);
  }
  cli_main_loop(cliloop_no_pw_setup,cliloop_no_pw_check,cliloop_always_continue,(void *)0x0);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    size_t ninstances = 0, instancessize = 8;
    struct cmdline_instance *instances = snewn(
        instancessize, struct cmdline_instance);
    struct cmdline_instance *ci = &instances[ninstances++];
    init_cmdline_instance(ci);

    if (argc <= 1) {
        /*
         * We're going to terminate with an error message below,
         * because there are no host keys. But we'll display the help
         * as additional standard-error output, if nothing else so
         * that people see the giant safety warning.
         */
        show_help(stderr);
        fputc('\n', stderr);
    }

    while (--argc > 0) {
        const char *arg = *++argv;
        const char *val;

        if (!strcmp(arg, "--help")) {
            show_help(stdout);
            exit(0);
        } else if (longoptnoarg(arg, "--version")) {
            show_version_and_exit();
        } else if (longoptnoarg(arg, "--verbose") || !strcmp(arg, "-v")) {
            verbose = true;
        } else if (longoptnoarg(arg, "--and")) {
            sgrowarray(instances, instancessize, ninstances);
            ci = &instances[ninstances++];
            init_cmdline_instance(ci);
        } else if (longoptarg(arg, "--listen", &val, &argc, &argv)) {
            if (val[0] == '/') {
                ci->listen_port = -1;
                ci->listen_socket = val;
            } else {
                ci->listen_port = atoi(val);
                ci->listen_socket = NULL;
            }
        } else if (!strcmp(arg, "--listen-once")) {
            listen_once = true;
        } else if (longoptarg(arg, "--hostkey", &val, &argc, &argv)) {
            Filename *keyfile;
            int keytype;
            const char *error;

            keyfile = filename_from_str(val);
            keytype = key_type(keyfile);

            if (keytype == SSH_KEYTYPE_SSH2) {
                ssh2_userkey *uk;
                ssh_key *key;
                uk = ppk_load_f(keyfile, NULL, &error);
                filename_free(keyfile);
                if (!uk || !uk->key) {
                    fprintf(stderr, "%s: unable to load host key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }
                char *invalid = ssh_key_invalid(uk->key, 0);
                if (invalid) {
                    fprintf(stderr, "%s: host key '%s' is unusable: "
                            "%s\n", appname, val, invalid);
                    exit(1);
                }
                key = uk->key;
                sfree(uk->comment);
                sfree(uk);

                for (int i = 0; i < ci->nhostkeys; i++)
                    if (ssh_key_alg(ci->hostkeys[i]) == ssh_key_alg(key)) {
                        fprintf(stderr, "%s: host key '%s' duplicates key "
                                "type %s\n", appname, val,
                                ssh_key_alg(key)->ssh_id);
                        exit(1);
                    }

                sgrowarray(ci->hostkeys, ci->hostkeysize, ci->nhostkeys);
                ci->hostkeys[ci->nhostkeys++] = key;
            } else if (keytype == SSH_KEYTYPE_SSH1) {
                if (ci->hostkey1) {
                    fprintf(stderr, "%s: host key '%s' is a redundant "
                            "SSH-1 host key\n", appname, val);
                    exit(1);
                }
                ci->hostkey1 = snew(RSAKey);
                if (!rsa1_load_f(keyfile, ci->hostkey1, NULL, &error)) {
                    fprintf(stderr, "%s: unable to load host key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }
            } else {
                fprintf(stderr, "%s: '%s' is not loadable as a "
                        "private key (%s)", appname, val,
                        key_type_to_str(keytype));
                exit(1);
            }
        } else if (longoptarg(arg, "--rsakexkey", &val, &argc, &argv)) {
            Filename *keyfile;
            int keytype;
            const char *error;

            keyfile = filename_from_str(val);
            keytype = key_type(keyfile);

            if (keytype != SSH_KEYTYPE_SSH1) {
                fprintf(stderr, "%s: '%s' is not loadable as an SSH-1 format "
                        "private key (%s)", appname, val,
                        key_type_to_str(keytype));
                exit(1);
            }

            if (ci->ssc.rsa_kex_key) {
                freersakey(ci->ssc.rsa_kex_key);
            } else {
                ci->ssc.rsa_kex_key = snew(RSAKey);
            }

            if (!rsa1_load_f(keyfile, ci->ssc.rsa_kex_key, NULL, &error)) {
                fprintf(stderr, "%s: unable to load RSA kex key '%s': "
                        "%s\n", appname, val, error);
                exit(1);
            }

            ci->ssc.rsa_kex_key->sshk.vt = &ssh_rsa;
        } else if (longoptarg(arg, "--userkey", &val, &argc, &argv)) {
            Filename *keyfile;
            int keytype;
            const char *error;

            keyfile = filename_from_str(val);
            keytype = key_type(keyfile);

            if (keytype == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716 ||
                keytype == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
                strbuf *sb = strbuf_new();
                struct AuthPolicy_ssh2_pubkey *node;
                void *blob;

                if (!ppk_loadpub_f(keyfile, NULL, BinarySink_UPCAST(sb),
                                   NULL, &error)) {
                    fprintf(stderr, "%s: unable to load user key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }

                node = snew_plus(struct AuthPolicy_ssh2_pubkey, sb->len);
                blob = snew_plus_get_aux(node);
                memcpy(blob, sb->u, sb->len);
                node->public_blob = make_ptrlen(blob, sb->len);

                node->next = ci->aps.ssh2keys;
                ci->aps.ssh2keys = node;

                strbuf_free(sb);
            } else if (keytype == SSH_KEYTYPE_SSH1_PUBLIC) {
                strbuf *sb = strbuf_new();
                BinarySource src[1];
                struct AuthPolicy_ssh1_pubkey *node;

                if (!rsa1_loadpub_f(keyfile, BinarySink_UPCAST(sb),
                                    NULL, &error)) {
                    fprintf(stderr, "%s: unable to load user key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }

                node = snew(struct AuthPolicy_ssh1_pubkey);
                BinarySource_BARE_INIT(src, sb->u, sb->len);
                get_rsa_ssh1_pub(src, &node->key, RSA_SSH1_EXPONENT_FIRST);

                node->next = ci->aps.ssh1keys;
                ci->aps.ssh1keys = node;

                strbuf_free(sb);
            } else {
                fprintf(stderr, "%s: '%s' is not loadable as a public key "
                        "(%s)\n", appname, val, key_type_to_str(keytype));
                exit(1);
            }
        } else if (longoptarg(arg, "--bannerfile", &val, &argc, &argv)) {
            FILE *fp = fopen(val, "r");
            if (!fp) {
                fprintf(stderr, "%s: %s: open: %s\n", appname,
                        val, strerror(errno));
                exit(1);
            }
            strbuf *sb = strbuf_new();
            if (!read_file_into(BinarySink_UPCAST(sb), fp)) {
                fprintf(stderr, "%s: %s: read: %s\n", appname,
                        val, strerror(errno));
                exit(1);
            }
            fclose(fp);
            ci->ssc.banner = ptrlen_from_strbuf(sb);
        } else if (longoptarg(arg, "--bannertext", &val, &argc, &argv)) {
            ci->ssc.banner = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--sessiondir", &val, &argc, &argv)) {
            ci->ssc.session_starting_dir = val;
        } else if (longoptarg(arg, "--kexinit-kex", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_KEX] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-hostkey", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_HOSTKEY] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-cscipher", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_CSCIPHER] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-csmac", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_CSMAC] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-cscomp", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_CSCOMP] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-sccipher", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_SCCIPHER] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-scmac", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_SCMAC] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-sccomp", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_SCCOMP] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--allow-auth", &val, &argc, &argv)) {
            unsigned method = auth_method_from_name(val);
            if (!method) {
                fprintf(stderr, "%s: unrecognised auth method '%s'\n",
                        appname, val);
                exit(1);
            }
            ci->auth_methods |= method;
        } else if (longoptarg(arg, "--deny-auth", &val, &argc, &argv)) {
            unsigned method = auth_method_from_name(val);
            if (!method) {
                fprintf(stderr, "%s: unrecognised auth method '%s'\n",
                        appname, val);
                exit(1);
            }
            ci->auth_methods &= ~method;
        } else if (longoptarg(arg, "--ssh1-ciphers", &val, &argc, &argv)) {
            ptrlen list = ptrlen_from_asciz(val);
            ptrlen word;
            unsigned long mask = 0;
            while (word = ptrlen_get_word(&list, ","), word.len != 0) {

#define SSH1_CIPHER_CASE(bitpos, name)                  \
                if (ptrlen_eq_string(word, name)) {     \
                    mask |= 1U << bitpos;               \
                    continue;                           \
                }
                SSH1_SUPPORTED_CIPHER_LIST(SSH1_CIPHER_CASE);
#undef SSH1_CIPHER_CASE

                fprintf(stderr, "%s: unrecognised SSH-1 cipher '%.*s'\n",
                        appname, PTRLEN_PRINTF(word));
                exit(1);
            }
            ci->ssc.ssh1_cipher_mask = mask;
        } else if (longoptnoarg(arg, "--ssh1-no-compression")) {
            ci->ssc.ssh1_allow_compression = false;
        } else if (longoptnoarg(arg, "--exitsignum")) {
            ci->ssc.exit_signal_numeric = true;
        } else if (longoptarg(arg, "--sshlog", &val, &argc, &argv) ||
                   longoptarg(arg, "-sshlog", &val, &argc, &argv)) {
            Filename *logfile = filename_from_str(val);
            conf_set_filename(ci->conf, CONF_logfilename, logfile);
            filename_free(logfile);
            conf_set_int(ci->conf, CONF_logtype, LGTYP_PACKETS);
            conf_set_int(ci->conf, CONF_logxfovr, LGXF_OVR);
        } else if (longoptarg(arg, "--sshrawlog", &val, &argc, &argv) ||
                   longoptarg(arg, "-sshrawlog", &val, &argc, &argv)) {
            Filename *logfile = filename_from_str(val);
            conf_set_filename(ci->conf, CONF_logfilename, logfile);
            filename_free(logfile);
            conf_set_int(ci->conf, CONF_logtype, LGTYP_SSHRAW);
            conf_set_int(ci->conf, CONF_logxfovr, LGXF_OVR);
        } else if (!strcmp(arg, "--pretend-to-accept-any-pubkey")) {
            ci->ssc.stunt_pretend_to_accept_any_pubkey = true;
        } else if (!strcmp(arg, "--open-unconditional-agent-socket")) {
            ci->ssc.stunt_open_unconditional_agent_socket = true;
        } else if (!strcmp(arg, "--allow-none-auth")) {
            /* backwards-compatibility synonym for --allow-auth=none */
            ci->auth_methods |= AUTHMETHOD_NONE;
        } else if (!strcmp(arg, "--allow-trivial-ki-auth")) {
            ci->ssc.stunt_allow_trivial_ki_auth = true;
        } else if (!strcmp(arg, "--return-success-to-pubkey-offer")) {
            ci->ssc.stunt_return_success_to_pubkey_offer = true;
        } else {
            fprintf(stderr, "%s: unrecognised option '%s'\n", appname, arg);
            exit(1);
        }
    }

    if (ninstances > 1 && listen_once) {
        fprintf(stderr, "%s: cannot listen once only with multiple server "
                "instances\n", appname);
        exit(1);
    }
    for (size_t i = 0; i < ninstances; i++) {
        ci = &instances[i];
        if (ci->nhostkeys == 0 && !ci->hostkey1) {
            fprintf(stderr, "%s: specify at least one host key\n", appname);
            exit(1);
        }
        if (ninstances > 1 && !(ci->listen_port >= 0 || ci->listen_socket)) {
            fprintf(stderr, "%s: cannot talk to stdio with multiple server "
                    "instances\n", appname);
            exit(1);
        }
    }

    random_ref();

    /*
     * Block SIGPIPE, so that we'll get EPIPE individually on
     * particular network connections that go wrong.
     */
    putty_signal(SIGPIPE, SIG_IGN);

    sk_init();
    uxsel_init();

    for (size_t i = 0; i < ninstances; i++)
        cmdline_instance_start(&instances[i]);

    cli_main_loop(cliloop_no_pw_setup, cliloop_no_pw_check,
                  cliloop_always_continue, NULL);

    return 0;
}